

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinR2SCANL_C>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  double e;
  double local_38;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar1;
  }
  pdVar3 = sigma + 2;
  for (; uVar2 << 3 != uVar1; uVar1 = uVar1 + 8) {
    kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinR2SCAN_C,_ExchCXX::BuiltinPC07OPT_K>_>::
    eval_exc_polar(*(double *)((long)rho + uVar1 * 2),*(double *)((long)rho + uVar1 * 2 + 8),
                   pdVar3[-2],pdVar3[-1],*pdVar3,*(double *)((long)lapl + uVar1 * 2),
                   *(double *)((long)lapl + uVar1 * 2 + 8),*(double *)((long)tau + uVar1 * 2),
                   *(double *)((long)tau + uVar1 * 2 + 8),&local_38);
    *(double *)((long)eps + uVar1) = local_38 * scal_fact + *(double *)((long)eps + uVar1);
    pdVar3 = pdVar3 + 3;
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;
    auto* tau_i   = tau   + 2*i;
    auto* lapl_i  = lapl  + 2*i;

    const auto lapl_i_a = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const auto lapl_i_b = traits::needs_laplacian ? lapl_i[1] : 0.0;
   
    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_i_a, lapl_i_b, tau_i[0], tau_i[1], 
      e );
    eps[i] += scal_fact * e;

  }

}